

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O1

void __thiscall
Group::Group(Group *this,string *groupNumber,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *data,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
                  *preps_map)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long lVar3;
  pointer pbVar4;
  long lVar5;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_data;
  string local_180;
  string local_160;
  string local_140;
  _Prime_rehash_policy *local_120;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_true>_>_>
  local_118;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_110;
  Lesson local_d8;
  
  (this->groupNumber)._M_dataplus._M_p = (pointer)&(this->groupNumber).field_2;
  pcVar2 = (groupNumber->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + groupNumber->_M_string_length);
  p_Var1 = &(this->lesson_set)._M_t._M_impl.super__Rb_tree_header;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar4 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((data->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    local_120 = &(preps_map->_M_h)._M_rehash_policy;
    lVar5 = 8;
    i = 0;
    do {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      lVar3 = *(long *)((long)pbVar4 + lVar5 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,lVar3,
                 *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar5) + lVar3);
      local_110._M_buckets = (__buckets_ptr)0x0;
      local_110._M_bucket_count = (preps_map->_M_h)._M_bucket_count;
      local_110._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_110._M_element_count = (preps_map->_M_h)._M_element_count;
      local_110._M_rehash_policy._M_max_load_factor = local_120->_M_max_load_factor;
      local_110._M_rehash_policy._4_4_ = *(undefined4 *)&local_120->field_0x4;
      local_110._M_rehash_policy._M_next_resize = local_120->_M_next_resize;
      local_110._M_single_bucket = (__node_base_ptr)0x0;
      local_118._M_h = (__hashtable_alloc *)&local_110;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Professor>,std::allocator<std::pair<std::__cxx11::string_const,Professor>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Professor>,std::allocator<std::pair<std::__cxx11::string_const,Professor>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,Professor>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Professor>,std::allocator<std::pair<std::__cxx11::string_const,Professor>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_110,&preps_map->_M_h,&local_118);
      Lesson::Lesson(&local_d8,i,&local_160,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
                      *)&local_110);
      std::vector<Lesson,_std::allocator<Lesson>_>::emplace_back<Lesson>
                (&this->lesson_map,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.time._M_dataplus._M_p != &local_d8.time.field_2) {
        operator_delete(local_d8.time._M_dataplus._M_p,
                        local_d8.time.field_2._M_allocated_capacity + 1);
      }
      std::vector<Professor,_std::allocator<Professor>_>::~vector(&local_d8.prep_list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.professor._M_dataplus._M_p != &local_d8.professor.field_2) {
        operator_delete(local_d8.professor._M_dataplus._M_p,
                        local_d8.professor.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.room._M_dataplus._M_p != &local_d8.room.field_2) {
        operator_delete(local_d8.room._M_dataplus._M_p,
                        local_d8.room.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.subject._M_dataplus._M_p != &local_d8.subject.field_2) {
        operator_delete(local_d8.subject._M_dataplus._M_p,
                        local_d8.subject.field_2._M_allocated_capacity + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      pbVar4 = (data->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      lVar3 = *(long *)((long)pbVar4 + lVar5 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,lVar3,
                 *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar5) + lVar3);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"#","");
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d8,&local_180,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->lesson_set,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_d8.lesson_id);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      i = i + 1;
      pbVar4 = (data->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (i < (ulong)((long)(data->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5));
  }
  return;
}

Assistant:

Group(std::string groupNumber, std::vector<std::string> data, std::unordered_map <std::string, Professor> preps_map) :
            groupNumber(groupNumber)
    {
        for(size_t i = 0; i < data.size(); i++) {

            //size_t key = i;

            lesson_map.push_back(Lesson(i, data[i],preps_map));
//            Lesson new1 = Lesson(i, data[i],preps_map);
//            new1.print();

            //Lesson one_lesson(i, data[i],preps_map);
            std::vector <std::string> raw_data = split(data[i], "#");
            lesson_set.insert(raw_data[0]);
//            std::vector<std::string>::const_iterator first = data.begin() + i ;
//            std::vector<std::string>::const_iterator last = data.begin() + i + 7;
//            std::vector<std::string> newVec(first, last);
//
//            Day one_day(i/7, newVec, preps_map);
//            days.push_back(one_day);
        }
    }